

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

void __thiscall Room::Room(Room *this,string *rn,ItemTable *itable,bool sld)

{
  allocator local_91 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_Room = (_func_int **)&PTR___cxa_pure_virtual_00133170;
  (this->rstate0)._M_dataplus._M_p = (pointer)&(this->rstate0).field_2;
  (this->rstate0)._M_string_length = 0;
  (this->rstate0).field_2._M_local_buf[0] = '\0';
  (this->rstate1)._M_dataplus._M_p = (pointer)&(this->rstate1).field_2;
  (this->rstate1)._M_string_length = 0;
  (this->rstate1).field_2._M_local_buf[0] = '\0';
  (this->rstate2)._M_dataplus._M_p = (pointer)&(this->rstate2).field_2;
  (this->rstate2)._M_string_length = 0;
  (this->rstate2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc1)._M_dataplus._M_p = (pointer)&(this->rsdesc1).field_2;
  (this->rsdesc1)._M_string_length = 0;
  (this->rsdesc1).field_2._M_local_buf[0] = '\0';
  (this->rsdesc2)._M_dataplus._M_p = (pointer)&(this->rsdesc2).field_2;
  (this->rsdesc2)._M_string_length = 0;
  (this->rsdesc2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc3)._M_dataplus._M_p = (pointer)&(this->rsdesc3).field_2;
  (this->rsdesc3)._M_string_length = 0;
  (this->rsdesc3).field_2._M_local_buf[0] = '\0';
  (this->rsdesc4)._M_dataplus._M_p = (pointer)&(this->rsdesc4).field_2;
  (this->rsdesc4)._M_string_length = 0;
  (this->rsdesc4).field_2._M_local_buf[0] = '\0';
  (this->roomName)._M_dataplus._M_p = (pointer)&(this->roomName).field_2;
  (this->roomName)._M_string_length = 0;
  (this->roomName).field_2._M_local_buf[0] = '\0';
  (this->displayName)._M_dataplus._M_p = (pointer)&(this->displayName).field_2;
  (this->displayName)._M_string_length = 0;
  (this->displayName).field_2._M_local_buf[0] = '\0';
  this->table = itable;
  std::__cxx11::string::_M_assign((string *)&this->displayName);
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,local_91);
  std::operator+(&local_50,&local_70,rn);
  std::__cxx11::string::operator=((string *)&this->roomName,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this->showLongDescription = sld;
  parseData(this);
  return;
}

Assistant:

Room::Room(std::string rn, ItemTable * itable, bool sld) {

    table = itable;
    displayName = rn;
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = sld;
    parseData();
}